

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall fasttext::DenseMatrix::dump(DenseMatrix *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  poVar1 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (0 < (this->super_Matrix).m_) {
    lVar4 = 0;
    do {
      lVar2 = (this->super_Matrix).n_;
      if (0 < lVar2) {
        lVar5 = 0;
        do {
          if (lVar5 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            lVar2 = (this->super_Matrix).n_;
          }
          uVar3 = lVar2 * lVar4 + lVar5;
          if ((this->data_).size_ <= uVar3) {
            __assert_fail("i * n_ + j < data_.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.h"
                          ,0x31,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
          }
          std::ostream::_M_insert<double>((double)(this->data_).mem_[uVar3]);
          lVar2 = (this->super_Matrix).n_;
          lVar5 = lVar5 + 1;
        } while (lVar5 < lVar2);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
      std::ostream::put((char)out);
      std::ostream::flush();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->super_Matrix).m_);
  }
  return;
}

Assistant:

void DenseMatrix::dump(std::ostream& out) const {
  out << m_ << " " << n_ << std::endl;
  for (int64_t i = 0; i < m_; i++) {
    for (int64_t j = 0; j < n_; j++) {
      if (j > 0) {
        out << " ";
      }
      out << at(i, j);
    }
    out << std::endl;
  }
}